

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.cc
# Opt level: O2

void __thiscall
kratos::EventVisitor::add_info(EventVisitor *this,shared_ptr<kratos::EventTracingStmt> *stmt)

{
  int iVar1;
  Stmt *s;
  undefined4 extraout_var;
  undefined1 local_b0 [8];
  EventInfo i;
  element_type *peVar2;
  
  peVar2 = (stmt->super___shared_ptr<kratos::EventTracingStmt,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  do {
    iVar1 = (*(peVar2->super_AuxiliaryStmt).super_Stmt.super_IRNode._vptr_IRNode[4])(peVar2);
    peVar2 = (element_type *)CONCAT44(extraout_var,iVar1);
    i.transaction.field_2._M_local_buf[8] = '\x01';
    if ((peVar2 == (element_type *)0x0) ||
       ((peVar2->super_AuxiliaryStmt).super_Stmt.super_IRNode.ast_node_type_ != StmtKind))
    goto LAB_001ed332;
  } while (((peVar2->super_AuxiliaryStmt).super_Stmt.type_ != Block) ||
          (*(int *)&(peVar2->event_name_).field_2 != 1));
  i.transaction.field_2._M_local_buf[8] = '\0';
LAB_001ed332:
  local_b0 = (undefined1  [8])&i.name._M_string_length;
  i.name._M_dataplus._M_p = (pointer)0x0;
  i.name._M_string_length._0_1_ = 0;
  i.name.field_2._8_8_ = &i.transaction._M_string_length;
  i.transaction._M_dataplus._M_p = (pointer)0x0;
  i.transaction._M_string_length._0_1_ = 0;
  i.fields._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&i.fields;
  i.fields._M_t._M_impl._0_4_ = 0;
  i.fields._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  i.fields._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  i.stmt.super___shared_ptr<kratos::EventTracingStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  i.fields._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  i.fields._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  i.fields._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       i.fields._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  std::__cxx11::string::_M_assign((string *)local_b0);
  std::__cxx11::string::_M_assign((string *)(i.name.field_2._M_local_buf + 8));
  peVar2 = (stmt->super___shared_ptr<kratos::EventTracingStmt,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  i._64_8_ = peVar2->action_type_;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
  ::operator=((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
               *)&i.type,&(peVar2->event_fields_)._M_t);
  std::__shared_ptr<kratos::EventTracingStmt,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<kratos::EventTracingStmt,_(__gnu_cxx::_Lock_policy)2> *)
             &i.fields._M_t._M_impl.super__Rb_tree_header._M_node_count,
             &stmt->super___shared_ptr<kratos::EventTracingStmt,_(__gnu_cxx::_Lock_policy)2>);
  std::vector<kratos::EventInfo,std::allocator<kratos::EventInfo>>::emplace_back<kratos::EventInfo&>
            ((vector<kratos::EventInfo,std::allocator<kratos::EventInfo>> *)&this->info,
             (EventInfo *)local_b0);
  EventInfo::~EventInfo((EventInfo *)local_b0);
  return;
}

Assistant:

void add_info(const std::shared_ptr<EventTracingStmt> &stmt) {
        bool combinational = true;
        auto *p = stmt->parent();

        while (p && p->ir_node_kind() == IRNodeKind::StmtKind) {
            auto *s = reinterpret_cast<Stmt *>(p);
            if (s->type() == StatementType::Block) {
                auto *b = reinterpret_cast<StmtBlock *>(s);
                if (b->block_type() == StatementBlockType::Sequential) {
                    combinational = false;
                    break;
                }
            }

            p = s->parent();
        }

        EventInfo i;
        i.name = stmt->event_name();
        i.transaction = stmt->transaction();
        i.combinational = combinational;
        i.type = stmt->action_type();
        i.fields = stmt->event_fields();
        i.stmt = stmt;

        info.emplace_back(i);
    }